

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *fg_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,int elem_offset,
               bool show_mesh,bool show_aabb)

{
  ImDrawListFlags IVar1;
  ImDrawVert *pIVar2;
  uint local_ec;
  ImVec2 *local_d0;
  ImVec2 local_c8;
  byte local_a5;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 p;
  int n;
  ImVec2 triangle [3];
  uint local_58;
  uint base_idx;
  ImDrawListFlags backup_flags;
  ImRect vtxs_rect;
  ImRect clip_rect;
  ImDrawIdx *idx_buffer;
  bool show_aabb_local;
  bool show_mesh_local;
  int elem_offset_local;
  ImDrawCmd *draw_cmd_local;
  ImDrawList *draw_list_local;
  ImDrawList *fg_draw_list_local;
  
  local_a5 = 1;
  if (!show_mesh) {
    local_a5 = show_aabb;
  }
  if ((local_a5 & 1) == 0) {
    __assert_fail("show_mesh || show_aabb",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3cec,
                  "static void ImGui::ShowMetricsWindow(bool *)::Funcs::NodeDrawCmdShowMeshAndBoundingBox(ImDrawList *, const ImDrawList *, const ImDrawCmd *, int, bool, bool)"
                 );
  }
  if ((draw_list->IdxBuffer).Size < 1) {
    local_c8.x = 0.0;
    local_c8.y = 0.0;
  }
  else {
    local_c8 = (ImVec2)(draw_list->IdxBuffer).Data;
  }
  clip_rect.Max = local_c8;
  ImRect::ImRect((ImRect *)&vtxs_rect.Max,&draw_cmd->ClipRect);
  ImRect::ImRect((ImRect *)&base_idx,3.4028235e+38,3.4028235e+38,-3.4028235e+38,-3.4028235e+38);
  IVar1 = fg_draw_list->Flags;
  fg_draw_list->Flags = fg_draw_list->Flags & 0xfffffffe;
  for (local_58 = elem_offset; local_58 < elem_offset + draw_cmd->ElemCount; local_58 = local_58 + 3
      ) {
    local_d0 = (ImVec2 *)&p.y;
    do {
      ImVec2::ImVec2(local_d0);
      local_d0 = local_d0 + 1;
    } while (local_d0 != triangle + 2);
    for (p.x = 0.0; (int)p.x < 3; p.x = (float)((int)p.x + 1)) {
      if (clip_rect.Max == (ImVec2)0x0) {
        local_ec = local_58 + (int)p.x;
      }
      else {
        local_ec = (uint)*(ushort *)((long)clip_rect.Max + (ulong)(local_58 + (int)p.x) * 2);
      }
      pIVar2 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,local_ec);
      local_84 = pIVar2->pos;
      *(ImVec2 *)&(&p)[(int)p.x].y = local_84;
      ImRect::Add((ImRect *)&base_idx,&local_84);
    }
    if (show_mesh) {
      ImDrawList::AddPolyline(fg_draw_list,(ImVec2 *)&p.y,3,0xff00ffff,true,1.0);
    }
  }
  if (show_aabb) {
    local_8c = ImFloor(&vtxs_rect.Max);
    local_94 = ImFloor(&clip_rect.Min);
    ImDrawList::AddRect(fg_draw_list,&local_8c,&local_94,0xffff00ff,0.0,0xf,1.0);
    local_9c = ImFloor((ImVec2 *)&base_idx);
    local_a4 = ImFloor(&vtxs_rect.Min);
    ImDrawList::AddRect(fg_draw_list,&local_9c,&local_a4,0xffffff00,0.0,0xf,1.0);
  }
  fg_draw_list->Flags = IVar1;
  return;
}

Assistant:

static void NodeDrawCmdShowMeshAndBoundingBox(ImDrawList* fg_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }